

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

HighsInt __thiscall
free_format_parser::HMpsFF::fillHessian(HMpsFF *this,HighsLogOptions *log_options)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  _Head_base<1UL,_int,_false> *p_Var6;
  int *piVar7;
  size_type sVar8;
  long lVar9;
  size_type __new_size;
  bool bVar10;
  vector<int,_std::allocator<int>_> q_length;
  _Vector_base<int,_std::allocator<int>_> local_38;
  value_type_conflict2 local_1c;
  
  lVar9 = (long)(this->q_entries).
                super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->q_entries).
                super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar9 == 0) {
    this->q_dim = 0;
  }
  else {
    __new_size = lVar9 >> 4;
    this->q_dim = this->num_col;
    std::vector<int,_std::allocator<int>_>::resize(&this->q_start,(long)this->num_col + 1);
    std::vector<int,_std::allocator<int>_>::resize(&this->q_index,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(&this->q_value,__new_size);
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              ((vector<int,_std::allocator<int>_> *)&local_38,(long)this->q_dim,&local_1c);
    p_Var6 = &(((this->q_entries).
                super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->super__Tuple_impl<0UL,_int,_int,_double>
              ).super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>;
    sVar8 = __new_size;
    while (bVar10 = sVar8 != 0, sVar8 = sVar8 - 1, bVar10) {
      local_38._M_impl.super__Vector_impl_data._M_start[p_Var6->_M_head_impl] =
           local_38._M_impl.super__Vector_impl_data._M_start[p_Var6->_M_head_impl] + 1;
      p_Var6 = p_Var6 + 4;
    }
    piVar4 = (this->q_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    *piVar4 = 0;
    for (lVar9 = 0; lVar9 < this->num_col; lVar9 = lVar9 + 1) {
      piVar4[lVar9 + 1] = local_38._M_impl.super__Vector_impl_data._M_start[lVar9] + piVar4[lVar9];
      local_38._M_impl.super__Vector_impl_data._M_start[lVar9] = piVar4[lVar9];
    }
    piVar4 = (this->q_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->q_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (int *)&(((this->q_entries).
                       super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Tuple_impl<0UL,_int,_int,_double>).super__Tuple_impl<1UL,_int,_double>.
                     field_0xc;
    while (bVar10 = __new_size != 0, __new_size = __new_size - 1, bVar10) {
      iVar2 = piVar7[-1];
      dVar1 = *(double *)(piVar7 + -3);
      piVar4[local_38._M_impl.super__Vector_impl_data._M_start[iVar2]] = *piVar7;
      iVar3 = local_38._M_impl.super__Vector_impl_data._M_start[iVar2];
      pdVar5[iVar3] = dVar1;
      local_38._M_impl.super__Vector_impl_data._M_start[iVar2] = iVar3 + 1;
      piVar7 = piVar7 + 4;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  }
  return 0;
}

Assistant:

HighsInt HMpsFF::fillHessian(const HighsLogOptions& log_options) {
  size_t num_entries = q_entries.size();
  if (!num_entries) {
    q_dim = 0;
    return 0;
  } else {
    q_dim = num_col;
  }

  q_start.resize(q_dim + 1);
  q_index.resize(num_entries);
  q_value.resize(num_entries);

  // Use q_length to determine the number of entries in each column,
  // and then as workspace to point to the next entry to be filled in
  // each column
  std::vector<HighsInt> q_length;
  q_length.assign(q_dim, 0);

  for (size_t iEl = 0; iEl < num_entries; iEl++) {
    HighsInt iCol = std::get<1>(q_entries[iEl]);
    q_length[iCol]++;
  }
  q_start[0] = 0;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    q_start[iCol + 1] = q_start[iCol] + q_length[iCol];
    q_length[iCol] = q_start[iCol];
  }

  for (size_t iEl = 0; iEl < num_entries; iEl++) {
    HighsInt iRow = std::get<0>(q_entries[iEl]);
    HighsInt iCol = std::get<1>(q_entries[iEl]);
    double value = std::get<2>(q_entries[iEl]);
    q_index[q_length[iCol]] = iRow;
    q_value[q_length[iCol]] = value;
    q_length[iCol]++;
  }
  return 0;
}